

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

void __thiscall
spv::Builder::accessChainStore
          (Builder *this,Id rvalue,Decoration nonUniform,MemoryAccessMask memoryAccess,Scope scope,
          uint alignment)

{
  pointer *ppuVar1;
  Instruction *pIVar2;
  Id IVar3;
  uint uVar4;
  Id target;
  StorageClass SVar5;
  pointer puVar6;
  MemoryAccessMask memoryAccess_00;
  pointer puVar7;
  Id IVar8;
  Id local_44;
  ulong local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  if ((this->accessChain).isRValue != false) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0xf87,
                  "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                 );
  }
  transferAccessChainSwizzle(this,true);
  if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    IVar3 = getResultingAccessChainType(this);
    uVar4 = getNumTypeConstituents(this,IVar3);
    puVar6 = (this->accessChain).swizzle.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (this->accessChain).swizzle.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)puVar7 - (long)puVar6 >> 2 != (ulong)uVar4) && ((this->accessChain).component == 0))
    {
      local_38 = &(this->accessChain).indexChain;
      local_40 = (ulong)rvalue;
      uVar4 = 0;
      while( true ) {
        if ((ulong)((long)puVar7 - (long)puVar6 >> 2) <= (ulong)uVar4) {
          return;
        }
        local_44 = makeUintConstant(this,puVar6[uVar4],false);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_38,&local_44);
        (this->accessChain).instr = 0;
        IVar3 = collapseAccessChain(this);
        addDecoration(this,IVar3,nonUniform,-1);
        ppuVar1 = &(this->accessChain).indexChain.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
        (this->accessChain).instr = 0;
        if ((this->accessChain).component != 0) break;
        pIVar2 = (this->module).idToInstruction.
                 super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl
                 .super__Vector_impl_data._M_start[local_40];
        if (pIVar2 == (Instruction *)0x0) {
          IVar8 = 0;
        }
        else {
          IVar8 = pIVar2->typeId;
        }
        IVar8 = getContainedTypeId(this,IVar8);
        IVar8 = createCompositeExtract(this,rvalue,IVar8,uVar4);
        alignment = alignment & -alignment;
        SVar5 = getStorageClass(this,IVar3);
        if (SVar5 == PhysicalStorageBuffer) {
          memoryAccess = memoryAccess | Aligned;
        }
        createStore(this,IVar8,IVar3,memoryAccess,scope,alignment);
        uVar4 = uVar4 + 1;
        puVar6 = (this->accessChain).swizzle.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (this->accessChain).swizzle.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      __assert_fail("accessChain.component == NoResult",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xf9a,
                    "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
                   );
    }
  }
  IVar3 = collapseAccessChain(this);
  addDecoration(this,IVar3,nonUniform,-1);
  if ((this->accessChain).component == 0) {
    if ((this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (this->accessChain).swizzle.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      IVar8 = 0;
      target = createLoad(this,IVar3,DecorationMax,MaskNone,Max,0);
      pIVar2 = (this->module).idToInstruction.
               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
               super__Vector_impl_data._M_start[target];
      if (pIVar2 != (Instruction *)0x0) {
        IVar8 = pIVar2->typeId;
      }
      rvalue = createLvalueSwizzle(this,IVar8,target,rvalue,&(this->accessChain).swizzle);
    }
    SVar5 = getStorageClass(this,IVar3);
    memoryAccess_00 = memoryAccess | Aligned;
    if (SVar5 != PhysicalStorageBuffer) {
      memoryAccess_00 = memoryAccess;
    }
    createStore(this,rvalue,IVar3,memoryAccess_00,scope,-alignment & alignment);
    return;
  }
  __assert_fail("accessChain.component == NoResult",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0xfae,
                "void spv::Builder::accessChainStore(Id, Decoration, spv::MemoryAccessMask, spv::Scope, unsigned int)"
               );
}

Assistant:

void Builder::accessChainStore(Id rvalue, Decoration nonUniform, spv::MemoryAccessMask memoryAccess, spv::Scope scope, unsigned int alignment)
{
    assert(accessChain.isRValue == false);

    transferAccessChainSwizzle(true);

    // If a swizzle exists and is not full and is not dynamic, then the swizzle will be broken into individual stores.
    if (accessChain.swizzle.size() > 0 &&
        getNumTypeComponents(getResultingAccessChainType()) != accessChain.swizzle.size() &&
        accessChain.component == NoResult) {
        for (unsigned int i = 0; i < accessChain.swizzle.size(); ++i) {
            accessChain.indexChain.push_back(makeUintConstant(accessChain.swizzle[i]));
            accessChain.instr = NoResult;

            Id base = collapseAccessChain();
            addDecoration(base, nonUniform);

            accessChain.indexChain.pop_back();
            accessChain.instr = NoResult;

            // dynamic component should be gone
            assert(accessChain.component == NoResult);

            Id source = createCompositeExtract(rvalue, getContainedTypeId(getTypeId(rvalue)), i);

            // take LSB of alignment
            alignment = alignment & ~(alignment & (alignment-1));
            if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
                memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
            }

            createStore(source, base, memoryAccess, scope, alignment);
        }
    }
    else {
        Id base = collapseAccessChain();
        addDecoration(base, nonUniform);

        Id source = rvalue;

        // dynamic component should be gone
        assert(accessChain.component == NoResult);

        // If swizzle still exists, it may be out-of-order, we must load the target vector,
        // extract and insert elements to perform writeMask and/or swizzle.
        if (accessChain.swizzle.size() > 0) {
            Id tempBaseId = createLoad(base, spv::NoPrecision);
            source = createLvalueSwizzle(getTypeId(tempBaseId), tempBaseId, source, accessChain.swizzle);
        }

        // take LSB of alignment
        alignment = alignment & ~(alignment & (alignment-1));
        if (getStorageClass(base) == StorageClassPhysicalStorageBufferEXT) {
            memoryAccess = (spv::MemoryAccessMask)(memoryAccess | spv::MemoryAccessAlignedMask);
        }

        createStore(source, base, memoryAccess, scope, alignment);
    }
}